

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O1

int b_array::first_ge<Map::Pair<long,int>>
              (Array<Map::Pair<long,_int>_> *data,size_t size,Pair<long,_int> *entry)

{
  Pair<long,_int> *pPVar1;
  int iVar2;
  ulong unaff_R14;
  bool bVar3;
  
  bVar3 = size != 0;
  if (bVar3) {
    unaff_R14 = 0;
    pPVar1 = Array<Map::Pair<long,_int>_>::operator[](data,0);
    if (pPVar1->key < entry->key) {
      unaff_R14 = 0;
      do {
        if (size - 1 == unaff_R14) {
          bVar3 = false;
          goto LAB_00117ce6;
        }
        unaff_R14 = unaff_R14 + 1;
        pPVar1 = Array<Map::Pair<long,_int>_>::operator[](data,unaff_R14);
      } while (pPVar1->key < entry->key);
      bVar3 = unaff_R14 < size;
    }
  }
LAB_00117ce6:
  iVar2 = (int)size;
  if (bVar3) {
    iVar2 = (int)unaff_R14;
  }
  return iVar2;
}

Assistant:

int first_ge(const b_array::Array<T>& data, size_t size, const T& entry) {
    for (size_t i = 0; i < size; i++) {
        if (data[i] >= entry) {
            return i;
        }
    }
    return size;
}